

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int av1_rc_bits_per_mb(AV1_COMP *cpi,FRAME_TYPE frame_type,int qindex,double correction_factor,
                      int accurate_estimate)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  FRAME_TYPE in_SIL;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  int ratio;
  double sse_sqrt;
  int mbs;
  int enumerator;
  double q;
  aom_bit_depth_t bit_depth;
  int is_screen_content_type;
  AV1_COMMON *cm;
  aom_bit_depth_t in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_3c;
  
  iVar2 = *(int *)(in_RDI + 0x9d2fc);
  iVar3 = *(int *)(*(long *)(in_RDI + 0x42008) + 0x48);
  dVar4 = av1_convert_qindex_to_q(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  local_3c = get_bpmb_enumerator(in_SIL,iVar2);
  if ((((*(int *)(in_RDI + 0x423dc) == 1) && (in_SIL != '\0')) && (in_ECX != 0)) &&
     (*(long *)(in_RDI + 0x9d650) != -1)) {
    iVar2 = *(int *)(in_RDI + 0x3c190);
    uVar1 = *(undefined8 *)(in_RDI + 0x9d650);
    auVar6._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar6._0_8_ = uVar1;
    auVar6._12_4_ = 0x45300000;
    dVar5 = sqrt((auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
    dVar5 = (double)((int)dVar5 << 9) / (double)iVar2;
    if (*(int *)(in_RDI + 0x608a4) == 0) {
      local_50 = get_init_ratio(dVar5);
    }
    else {
      local_50 = *(int *)(in_RDI + 0x608a4);
    }
    if ((int)((double)local_50 * dVar5) < 0x4e21) {
      local_54 = 20000;
    }
    else {
      local_54 = (int)((double)local_50 * dVar5);
    }
    if (local_54 < 170000) {
      if ((int)((double)local_50 * dVar5) < 0x4e21) {
        local_58 = 20000;
      }
      else {
        local_58 = (int)((double)local_50 * dVar5);
      }
      local_5c = local_58;
    }
    else {
      local_5c = 170000;
    }
    local_3c = local_5c;
  }
  else if ((((*(int *)(in_RDI + 0x423dc) == 1) && (in_SIL == '\0')) &&
           ((*(int *)(in_RDI + 0x60cf4) != 0 && ((iVar3 == 8 && (*(int *)(in_RDI + 0x423b4) != 0))))
           )) && (*(int *)(in_RDI + 0x9d330) == 0)) {
    local_3c = adjust_rtc_keyframe((RATE_CONTROL *)(in_RDI + 0x60770),local_3c);
  }
  return (int)(((double)local_3c * in_XMM0_Qa) / dVar4);
}

Assistant:

int av1_rc_bits_per_mb(const AV1_COMP *cpi, FRAME_TYPE frame_type, int qindex,
                       double correction_factor, int accurate_estimate) {
  const AV1_COMMON *const cm = &cpi->common;
  const int is_screen_content_type = cpi->is_screen_content_type;
  const aom_bit_depth_t bit_depth = cm->seq_params->bit_depth;
  const double q = av1_convert_qindex_to_q(qindex, bit_depth);
  int enumerator = get_bpmb_enumerator(frame_type, is_screen_content_type);

  assert(correction_factor <= MAX_BPB_FACTOR &&
         correction_factor >= MIN_BPB_FACTOR);

  if (cpi->oxcf.rc_cfg.mode == AOM_CBR && frame_type != KEY_FRAME &&
      accurate_estimate && cpi->rec_sse != UINT64_MAX) {
    const int mbs = cm->mi_params.MBs;
    const double sse_sqrt =
        (double)((int)sqrt((double)(cpi->rec_sse)) << BPER_MB_NORMBITS) /
        (double)mbs;
    const int ratio = (cpi->rc.bit_est_ratio == 0) ? get_init_ratio(sse_sqrt)
                                                   : cpi->rc.bit_est_ratio;
    // Clamp the enumerator to lower the q fluctuations.
    enumerator = AOMMIN(AOMMAX((int)(ratio * sse_sqrt), 20000), 170000);
  } else if (cpi->oxcf.rc_cfg.mode == AOM_CBR && frame_type == KEY_FRAME &&
             cpi->sf.rt_sf.rc_adjust_keyframe && bit_depth == 8 &&
             cpi->oxcf.rc_cfg.max_intra_bitrate_pct > 0 &&
             cpi->svc.spatial_layer_id == 0) {
    enumerator = adjust_rtc_keyframe(&cpi->rc, enumerator);
  }
  // q based adjustment to baseline enumerator
  return (int)(enumerator * correction_factor / q);
}